

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O2

void jmp_append(FuncState *fs,BCPos *l1,BCPos l2)

{
  uint pc;
  uint uVar1;
  long lVar2;
  
  if (l2 != 0xffffffff) {
    if (*l1 != 0xffffffff) {
      uVar1 = *l1;
      do {
        pc = uVar1;
        lVar2 = (ulong)*(ushort *)((long)&fs->bcbase[pc].ins + 2) - 0x8000;
        if (lVar2 == -1) break;
        uVar1 = (int)lVar2 + pc + 1;
      } while (uVar1 != 0xffffffff);
      jmp_patchins(fs,pc,l2);
      return;
    }
    *l1 = l2;
  }
  return;
}

Assistant:

static void jmp_append(FuncState *fs, BCPos *l1, BCPos l2)
{
  if (l2 == NO_JMP) {
    return;
  } else if (*l1 == NO_JMP) {
    *l1 = l2;
  } else {
    BCPos list = *l1;
    BCPos next;
    while ((next = jmp_next(fs, list)) != NO_JMP)  /* Find last element. */
      list = next;
    jmp_patchins(fs, list, l2);
  }
}